

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::HasProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,
          bool *noRedecl,PropertyValueInfo *info)

{
  ObjectSlotAttributes attributes;
  uint16 uVar1;
  PropertyIndex index_00;
  TypePath *this_00;
  ObjectSlotAttributes **ppOVar2;
  ObjectSlotAttributes attr;
  PropertyIndex index;
  PropertyValueInfo *info_local;
  bool *noRedecl_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  if (noRedecl != (bool *)0x0) {
    *noRedecl = false;
  }
  this_00 = PathTypeHandlerBase::GetTypePath((PathTypeHandlerBase *)this);
  uVar1 = PathTypeHandlerBase::GetPathLength((PathTypeHandlerBase *)this);
  index_00 = TypePath::LookupInline(this_00,propertyId,(uint)uVar1);
  if (index_00 == 0xffff) {
    this_local._4_4_ =
         PathTypeHandlerBase::HasProperty
                   ((PathTypeHandlerBase *)this,instance,propertyId,noRedecl,info);
  }
  else {
    ppOVar2 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                        ((WriteBarrierPtr *)&this->attributes);
    attributes = (*ppOVar2)[index_00];
    if ((attributes & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
      if ((attributes & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) {
        PathTypeHandlerBase::SetPropertyValueInfo
                  ((PathTypeHandlerBase *)this,info,&instance->super_RecyclableObject,index_00,
                   attributes);
        this_local._4_4_ = 1;
      }
      else {
        PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerWithAttr::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        PropertyIndex index = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (index == Constants::NoSlot)
        {
            return __super::HasProperty(instance, propertyId, noRedecl, info);
        }

        ObjectSlotAttributes attr = attributes[index];

        if (attr & ObjectSlotAttr_Deleted)
        {
            return false;
        }

        if (attr & ObjectSlotAttr_Accessor)
        {
            // PropertyAttributes is only one byte so it can't carry out data about whether this is an accessor.
            // Accessors must be cached differently than normal properties, so if we want to cache this we must
            // do so here rather than in the caller. However, caching here would require passing originalInstance and
            // requestContext through a wide variety of call paths to this point (like we do for GetProperty), for
            // very little improvement. For now, just block caching this case.
            PropertyValueInfo::SetNoCache(info, instance);
            return true;
        }

        this->SetPropertyValueInfo(info, instance, index, attr);
        return true;
    }